

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

void __thiscall event_track::DASHEventMessageBoxv1::print(DASHEventMessageBoxv1 *this)

{
  ostream *poVar1;
  void *pvVar2;
  uchar *bytes_to_encode;
  size_type in_len;
  string local_30;
  DASHEventMessageBoxv1 *local_10;
  DASHEventMessageBoxv1 *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"== Event Message instance Box emsg v1 ==");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," reserved (timescale) ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)&(this->super_full_box).field_0x6c);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," presentation_time: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->presentation_time_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," event_duration: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->event_duration_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," id: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->id_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," scheme id uri: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->scheme_id_uri_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," value:  ");
  poVar1 = std::operator<<(poVar1,(string *)&this->value_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," message data b64: ");
  bytes_to_encode =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->message_data_);
  in_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
  base64_encode_abi_cxx11_(&local_30,bytes_to_encode,in_len);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void print()
		{
			std::cout << "== Event Message instance Box emsg v1 ==" << std::endl;
			std::cout << " reserved (timescale) " << timescale_ << std::endl;
			std::cout << " presentation_time: " << presentation_time_ << std::endl;
			std::cout << " event_duration: " << event_duration_ << std::endl;
			std::cout << " id: " << id_ << std::endl;
			std::cout << " scheme id uri: " << scheme_id_uri_ << std::endl;
			std::cout << " value:  " << value_ << std::endl;
			std::cout << " message data b64: " << base64_encode(message_data_.data(), message_data_.size()) << std::endl;
		}